

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool Args::details::isMisspelledName(String *misspelled,String *correct)

{
  __type _Var1;
  String cs;
  String ms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  _Var1 = false;
  if ((misspelled->_M_string_length != 0) && (_Var1 = false, correct->_M_string_length != 0)) {
    std::__cxx11::string::string((string *)&local_38,(string *)misspelled);
    std::__cxx11::string::string((string *)&local_58,(string *)correct);
    std::
    __sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_38._M_dataplus._M_p,local_38._M_dataplus._M_p + local_38._M_string_length);
    std::
    __sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58._M_dataplus._M_p,local_58._M_dataplus._M_p + local_58._M_string_length);
    _Var1 = std::operator==(&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return _Var1;
}

Assistant:

static inline bool
isMisspelledName( const String & misspelled,
	const String & correct )
{
	if( !misspelled.empty() && !correct.empty() )
	{
		String ms = misspelled;
		String cs = correct;

		std::sort( ms.begin(), ms.end() );
		std::sort( cs.begin(), cs.end() );

		return ( ms == cs );
	}
	else
		return false;
}